

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_top(HSQUIRRELVM v)

{
  SQOuter *pSVar1;
  long lVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  
  pSVar3 = stack_get(v,1);
  pSVar1 = (pSVar3->super_SQObject)._unVal.pOuter;
  lVar2 = pSVar1->_idx;
  if (0 < lVar2) {
    SQVM::Push(v,pSVar1->_valptr + lVar2 + -1);
    return 1;
  }
  SVar4 = sq_throwerror(v,"top() on a empty array");
  return SVar4;
}

Assistant:

static SQInteger array_top(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    if(_array(o)->Size()>0){
        v->Push(_array(o)->Top());
        return 1;
    }
    else return sq_throwerror(v,_SC("top() on a empty array"));
}